

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl_logging_unittest.cc
# Opt level: O3

int main(int param_1,char **param_2)

{
  _Safe_iterator_base **pp_Var1;
  uint *puVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  mapped_type *pmVar6;
  _Safe_iterator_base *p_Var7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  mapped_type *pmVar9;
  undefined1 auVar10 [8];
  size_type sVar11;
  _Safe_iterator_base *extraout_RAX;
  _Hashtable *in_R9;
  const_iterator cVar12;
  _Hashtable_const_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int,___gnu_cxx::hash<int>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<int>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  begin;
  _Hashtable_const_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int,___gnu_cxx::hash<int>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<int>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  end;
  undefined1 local_268 [8];
  ostringstream ss;
  ios_base local_1f8 [272];
  undefined1 auStack_e8 [8];
  vector<int,_std::allocator<int>_> v;
  CheckOpString local_a0;
  undefined1 local_98 [8];
  vector<int,_std::allocator<int>_> copied_v;
  size_t local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  auStack_e8 = (undefined1  [8])0x0;
  v.
  super__Safe_container<std::__debug::vector<int,_std::allocator<int>_>,_std::allocator<int>,___gnu_debug::_Safe_sequence,_true>
  .super__Safe_sequence<std::__debug::vector<int,_std::allocator<int>_>_>.super__Safe_sequence_base.
  _M_iterators = (_Safe_iterator_base *)0x0;
  v.
  super__Safe_container<std::__debug::vector<int,_std::allocator<int>_>,_std::allocator<int>,___gnu_debug::_Safe_sequence,_true>
  .super__Safe_sequence<std::__debug::vector<int,_std::allocator<int>_>_>.super__Safe_sequence_base.
  _M_const_iterators._0_4_ = 1;
  local_268._0_4_ = 10;
  v._16_32_ = ZEXT432(0) << 0x40;
  std::__debug::vector<int,_std::allocator<int>_>::emplace_back<int>
            ((vector<int,_std::allocator<int>_> *)auStack_e8,(int *)local_268);
  local_268._0_4_ = 0x14;
  std::__debug::vector<int,_std::allocator<int>_>::emplace_back<int>
            ((vector<int,_std::allocator<int>_> *)auStack_e8,(int *)local_268);
  local_268._0_4_ = 0x1e;
  std::__debug::vector<int,_std::allocator<int>_>::emplace_back<int>
            ((vector<int,_std::allocator<int>_> *)auStack_e8,(int *)local_268);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_268);
  operator<<((ostream *)local_268,(vector<int,_std::allocator<int>_> *)auStack_e8);
  std::__cxx11::stringbuf::str();
  iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                     "10 20 30");
  pp_Var1 = &copied_v.
             super__Safe_container<std::__debug::vector<int,_std::allocator<int>_>,_std::allocator<int>,___gnu_debug::_Safe_sequence,_true>
             .super__Safe_sequence<std::__debug::vector<int,_std::allocator<int>_>_>.
             super__Safe_sequence_base._M_const_iterators;
  if (local_98 != (undefined1  [8])pp_Var1) {
    free((void *)local_98);
  }
  if (iVar4 == 0) {
    std::__debug::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_98,
               (vector<int,_std::allocator<int>_> *)auStack_e8);
    local_a0.str_ =
         google::
         Check_EQImpl<std::__debug::vector<int,std::allocator<int>>,std::__debug::vector<int,std::allocator<int>>>
                   ((vector<int,_std::allocator<int>_> *)auStack_e8,
                    (vector<int,_std::allocator<int>_> *)local_98,"v == copied_v");
    if ((_Safe_iterator_base *)local_a0.str_ == (_Safe_iterator_base *)0x0) {
      std::__debug::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)local_98);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_268);
      std::ios_base::~ios_base(local_1f8);
      std::__debug::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)auStack_e8);
      v.
      super__Safe_vector<std::__debug::vector<int,_std::allocator<int>_>,_std::__cxx1998::vector<int,_std::allocator<int>_>_>
      ._M_guaranteed_capacity = (size_type)&v.super_vector<int,_std::allocator<int>_>;
      local_268._0_4_ = 0x14;
      auStack_e8 = (undefined1  [8])0x0;
      v.
      super__Safe_container<std::__debug::vector<int,_std::allocator<int>_>,_std::allocator<int>,___gnu_debug::_Safe_sequence,_true>
      .super__Safe_sequence<std::__debug::vector<int,_std::allocator<int>_>_>.
      super__Safe_sequence_base._M_iterators = (_Safe_iterator_base *)0x0;
      v.
      super__Safe_container<std::__debug::vector<int,_std::allocator<int>_>,_std::allocator<int>,___gnu_debug::_Safe_sequence,_true>
      .super__Safe_sequence<std::__debug::vector<int,_std::allocator<int>_>_>.
      super__Safe_sequence_base._M_const_iterators._0_4_ = 1;
      puVar2 = &v.
                super__Safe_container<std::__debug::vector<int,_std::allocator<int>_>,_std::allocator<int>,___gnu_debug::_Safe_sequence,_true>
                .super__Safe_sequence<std::__debug::vector<int,_std::allocator<int>_>_>.
                super__Safe_sequence_base._M_version;
      v.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
      v.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      v.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)v.
                    super__Safe_vector<std::__debug::vector<int,_std::allocator<int>_>,_std::__cxx1998::vector<int,_std::allocator<int>_>_>
                    ._M_guaranteed_capacity;
      pmVar6 = std::__cxx1998::
               map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)puVar2,(key_type *)local_268);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                (pmVar6,0,pmVar6->_M_string_length,"twenty",6);
      local_268._0_4_ = 10;
      pmVar6 = std::__cxx1998::
               map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)puVar2,(key_type *)local_268);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                (pmVar6,0,pmVar6->_M_string_length,"ten",3);
      local_268._0_4_ = 0x1e;
      pmVar6 = std::__cxx1998::
               map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)puVar2,(key_type *)local_268);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                (pmVar6,0,pmVar6->_M_string_length,"thirty",6);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_268);
      operator<<((ostream *)local_268,
                 (map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)auStack_e8);
      std::__cxx11::stringbuf::str();
      uVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                      "(10, ten) (20, twenty) (30, thirty)");
      p_Var7 = (_Safe_iterator_base *)(ulong)uVar5;
      if (local_98 != (undefined1  [8])pp_Var1) {
        free((void *)local_98);
      }
      if (uVar5 == 0) {
        std::__debug::
        map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::map((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_98,
              (map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)auStack_e8);
        if (local_58 == 0) {
          bVar3 = std::__equal<false>::
                  equal<std::_Rb_tree_const_iterator<std::pair<int_const,std::__cxx11::string>>,std::_Rb_tree_const_iterator<std::pair<int_const,std::__cxx11::string>>>
                            ((_Rb_tree_const_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )v.super_vector<int,_std::allocator<int>_>.
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage,
                             (_Rb_tree_const_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )&v.super_vector<int,_std::allocator<int>_>,
                             (_Rb_tree_const_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )copied_v.super_vector<int,_std::allocator<int>_>.
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage);
          if (!bVar3) goto LAB_00115ffd;
        }
        else {
LAB_00115ffd:
          local_a0.str_ =
               google::
               MakeCheckOpString<std::__debug::map<int,std::__cxx11::string,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>,std::__debug::map<int,std::__cxx11::string,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>>
                         ((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)auStack_e8,
                          (map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_98,"m == copied_m");
          if ((_Safe_iterator_base *)local_a0.str_ != (_Safe_iterator_base *)0x0) {
            google::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_50,
                       "/workspace/llm4binary/github/license_c_cmakelists/koeppl[P]separate_chaining/external/glog/src/stl_logging_unittest.cc"
                       ,0x62,&local_a0);
            google::LogMessage::stream((LogMessage *)&local_50);
            goto LAB_001162c7;
          }
        }
        std::__debug::
        map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~map((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_98);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_268);
        std::ios_base::~ios_base(local_1f8);
        std::__debug::
        map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~map((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)auStack_e8);
        __gnu_cxx::hash_set<int,___gnu_cxx::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::
        hash_set((hash_set<int,___gnu_cxx::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
                 auStack_e8);
        local_98._0_4_ = 10;
        __gnu_cxx::
        hashtable<int,_int,___gnu_cxx::hash<int>,_std::_Identity<int>,_std::equal_to<int>,_std::allocator<int>_>
        ::resize((hashtable<int,_int,___gnu_cxx::hash<int>,_std::_Identity<int>,_std::equal_to<int>,_std::allocator<int>_>
                  *)auStack_e8,1);
        __gnu_cxx::
        hashtable<int,_int,___gnu_cxx::hash<int>,_std::_Identity<int>,_std::equal_to<int>,_std::allocator<int>_>
        ::insert_unique_noresize
                  ((pair<__gnu_cxx::_Hashtable_iterator<int,_int,___gnu_cxx::hash<int>,_std::_Identity<int>,_std::equal_to<int>,_std::allocator<int>_>,_bool>
                    *)local_268,
                   (hashtable<int,_int,___gnu_cxx::hash<int>,_std::_Identity<int>,_std::equal_to<int>,_std::allocator<int>_>
                    *)auStack_e8,(value_type_conflict *)local_98);
        local_98._0_4_ = 0x14;
        __gnu_cxx::
        hashtable<int,_int,___gnu_cxx::hash<int>,_std::_Identity<int>,_std::equal_to<int>,_std::allocator<int>_>
        ::resize((hashtable<int,_int,___gnu_cxx::hash<int>,_std::_Identity<int>,_std::equal_to<int>,_std::allocator<int>_>
                  *)auStack_e8,1);
        __gnu_cxx::
        hashtable<int,_int,___gnu_cxx::hash<int>,_std::_Identity<int>,_std::equal_to<int>,_std::allocator<int>_>
        ::insert_unique_noresize
                  ((pair<__gnu_cxx::_Hashtable_iterator<int,_int,___gnu_cxx::hash<int>,_std::_Identity<int>,_std::equal_to<int>,_std::allocator<int>_>,_bool>
                    *)local_268,
                   (hashtable<int,_int,___gnu_cxx::hash<int>,_std::_Identity<int>,_std::equal_to<int>,_std::allocator<int>_>
                    *)auStack_e8,(value_type_conflict *)local_98);
        local_98._0_4_ = 0x1e;
        __gnu_cxx::
        hashtable<int,_int,___gnu_cxx::hash<int>,_std::_Identity<int>,_std::equal_to<int>,_std::allocator<int>_>
        ::resize((hashtable<int,_int,___gnu_cxx::hash<int>,_std::_Identity<int>,_std::equal_to<int>,_std::allocator<int>_>
                  *)auStack_e8,1);
        __gnu_cxx::
        hashtable<int,_int,___gnu_cxx::hash<int>,_std::_Identity<int>,_std::equal_to<int>,_std::allocator<int>_>
        ::insert_unique_noresize
                  ((pair<__gnu_cxx::_Hashtable_iterator<int,_int,___gnu_cxx::hash<int>,_std::_Identity<int>,_std::equal_to<int>,_std::allocator<int>_>,_bool>
                    *)local_268,
                   (hashtable<int,_int,___gnu_cxx::hash<int>,_std::_Identity<int>,_std::equal_to<int>,_std::allocator<int>_>
                    *)auStack_e8,(value_type_conflict *)local_98);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_268);
        _local_98 = (const_iterator)
                    __gnu_cxx::
                    hashtable<int,_int,___gnu_cxx::hash<int>,_std::_Identity<int>,_std::equal_to<int>,_std::allocator<int>_>
                    ::begin((hashtable<int,_int,___gnu_cxx::hash<int>,_std::_Identity<int>,_std::equal_to<int>,_std::allocator<int>_>
                             *)auStack_e8);
        if (local_98 != (undefined1  [8])0x0) {
          uVar5 = 0;
          do {
            auVar10 = local_98;
            if (uVar5 != 0) {
              local_50._M_dataplus._M_p._0_4_ = CONCAT31(local_50._M_dataplus._M_p._1_3_,0x20);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_268,(char *)&local_50,1);
              auVar10 = local_98;
            }
            std::ostream::operator<<((ostream *)local_268,((_Node *)auVar10)->_M_val);
            __gnu_cxx::
            _Hashtable_const_iterator<int,_int,___gnu_cxx::hash<int>,_std::_Identity<int>,_std::equal_to<int>,_std::allocator<int>_>
            ::operator++((_Hashtable_const_iterator<int,_int,___gnu_cxx::hash<int>,_std::_Identity<int>,_std::equal_to<int>,_std::allocator<int>_>
                          *)local_98);
          } while ((uVar5 < 99) && (uVar5 = uVar5 + 1, local_98 != (undefined1  [8])0x0));
          if (local_98 != (undefined1  [8])0x0) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_268," ...",4);
          }
        }
        std::__cxx11::stringbuf::str();
        p_Var7 = copied_v.
                 super__Safe_container<std::__debug::vector<int,_std::allocator<int>_>,_std::allocator<int>,___gnu_debug::_Safe_sequence,_true>
                 .super__Safe_sequence<std::__debug::vector<int,_std::allocator<int>_>_>.
                 super__Safe_sequence_base._M_iterators;
        if (local_98 != (undefined1  [8])pp_Var1) {
          free((void *)local_98);
        }
        if (p_Var7 != (_Safe_iterator_base *)0x8) goto LAB_001161e3;
        std::__cxx11::stringbuf::str();
        p_Var7 = (_Safe_iterator_base *)
                 std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                      "10",0,2);
        if (local_98 != (undefined1  [8])pp_Var1) {
          free((void *)local_98);
        }
        if (p_Var7 == (_Safe_iterator_base *)0xffffffffffffffff) goto LAB_001161e8;
        std::__cxx11::stringbuf::str();
        p_Var7 = (_Safe_iterator_base *)
                 std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                      "20",0,2);
        if (local_98 != (undefined1  [8])pp_Var1) {
          free((void *)local_98);
        }
        if (p_Var7 == (_Safe_iterator_base *)0xffffffffffffffff) goto LAB_001161ed;
        std::__cxx11::stringbuf::str();
        p_Var7 = (_Safe_iterator_base *)
                 std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                      "30",0,2);
        if (local_98 != (undefined1  [8])pp_Var1) {
          free((void *)local_98);
        }
        if (p_Var7 == (_Safe_iterator_base *)0xffffffffffffffff) goto LAB_001161f2;
        __gnu_cxx::
        hashtable<int,_int,___gnu_cxx::hash<int>,_std::_Identity<int>,_std::equal_to<int>,_std::allocator<int>_>
        ::hashtable((hashtable<int,_int,___gnu_cxx::hash<int>,_std::_Identity<int>,_std::equal_to<int>,_std::allocator<int>_>
                     *)local_98,
                    (hashtable<int,_int,___gnu_cxx::hash<int>,_std::_Identity<int>,_std::equal_to<int>,_std::allocator<int>_>
                     *)auStack_e8);
        bVar3 = __gnu_cxx::operator==
                          ((hashtable<int,_int,___gnu_cxx::hash<int>,_std::_Identity<int>,_std::equal_to<int>,_std::allocator<int>_>
                            *)auStack_e8,
                           (hashtable<int,_int,___gnu_cxx::hash<int>,_std::_Identity<int>,_std::equal_to<int>,_std::allocator<int>_>
                            *)local_98);
        if (!bVar3) {
          local_a0.str_ =
               google::
               MakeCheckOpString<__gnu_cxx::hash_set<int,__gnu_cxx::hash<int>,std::equal_to<int>,std::allocator<int>>,__gnu_cxx::hash_set<int,__gnu_cxx::hash<int>,std::equal_to<int>,std::allocator<int>>>
                         ((hash_set<int,___gnu_cxx::hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                           *)auStack_e8,
                          (hash_set<int,___gnu_cxx::hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                           *)local_98,"hs == copied_hs");
          if ((_Safe_iterator_base *)local_a0.str_ != (_Safe_iterator_base *)0x0) {
            google::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_50,
                       "/workspace/llm4binary/github/license_c_cmakelists/koeppl[P]separate_chaining/external/glog/src/stl_logging_unittest.cc"
                       ,0x73,&local_a0);
            google::LogMessage::stream((LogMessage *)&local_50);
            goto LAB_001162c7;
          }
        }
        __gnu_cxx::
        hashtable<int,_int,___gnu_cxx::hash<int>,_std::_Identity<int>,_std::equal_to<int>,_std::allocator<int>_>
        ::~hashtable((hashtable<int,_int,___gnu_cxx::hash<int>,_std::_Identity<int>,_std::equal_to<int>,_std::allocator<int>_>
                      *)local_98);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_268);
        std::ios_base::~ios_base(local_1f8);
        __gnu_cxx::
        hashtable<int,_int,___gnu_cxx::hash<int>,_std::_Identity<int>,_std::equal_to<int>,_std::allocator<int>_>
        ::~hashtable((hashtable<int,_int,___gnu_cxx::hash<int>,_std::_Identity<int>,_std::equal_to<int>,_std::allocator<int>_>
                      *)auStack_e8);
        __gnu_cxx::
        hash_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::hash<int>,_std::equal_to<int>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::hash_map((hash_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::hash<int>,_std::equal_to<int>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)auStack_e8);
        local_268._0_4_ = 10;
        pbVar8 = __gnu_cxx::
                 hash_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::hash<int>,_std::equal_to<int>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((hash_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::hash<int>,_std::equal_to<int>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)auStack_e8,(key_type *)local_268);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                  (pbVar8,0,pbVar8->_M_string_length,"ten",3);
        local_268._0_4_ = 0x14;
        pbVar8 = __gnu_cxx::
                 hash_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::hash<int>,_std::equal_to<int>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((hash_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::hash<int>,_std::equal_to<int>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)auStack_e8,(key_type *)local_268);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                  (pbVar8,0,pbVar8->_M_string_length,"twenty",6);
        local_268._0_4_ = 0x1e;
        pbVar8 = __gnu_cxx::
                 hash_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::hash<int>,_std::equal_to<int>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((hash_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::hash<int>,_std::equal_to<int>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)auStack_e8,(key_type *)local_268);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                  (pbVar8,0,pbVar8->_M_string_length,"thirty",6);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_268);
        cVar12 = __gnu_cxx::
                 hashtable<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int,___gnu_cxx::hash<int>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<int>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((hashtable<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int,___gnu_cxx::hash<int>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<int>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)auStack_e8);
        begin._M_cur = cVar12._M_ht;
        begin._M_ht = (_Hashtable *)0x0;
        end._M_ht = in_R9;
        end._M_cur = (_Node *)auStack_e8;
        google::
        PrintSequence<__gnu_cxx::_Hashtable_const_iterator<std::pair<int_const,std::__cxx11::string>,int,__gnu_cxx::hash<int>,std::_Select1st<std::pair<int_const,std::__cxx11::string>>,std::equal_to<int>,std::allocator<std::__cxx11::string>>>
                  ((google *)local_268,(ostream *)cVar12._M_cur,begin,end);
        std::__cxx11::stringbuf::str();
        p_Var7 = copied_v.
                 super__Safe_container<std::__debug::vector<int,_std::allocator<int>_>,_std::allocator<int>,___gnu_debug::_Safe_sequence,_true>
                 .super__Safe_sequence<std::__debug::vector<int,_std::allocator<int>_>_>.
                 super__Safe_sequence_base._M_iterators;
        if (local_98 != (undefined1  [8])pp_Var1) {
          free((void *)local_98);
        }
        if (p_Var7 != (_Safe_iterator_base *)0x23) goto LAB_001161f7;
        std::__cxx11::stringbuf::str();
        p_Var7 = (_Safe_iterator_base *)
                 std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                      "(10, ten)",0,9);
        if (local_98 != (undefined1  [8])pp_Var1) {
          free((void *)local_98);
        }
        if (p_Var7 == (_Safe_iterator_base *)0xffffffffffffffff) goto LAB_001161fc;
        std::__cxx11::stringbuf::str();
        p_Var7 = (_Safe_iterator_base *)
                 std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                      "(20, twenty)",0,0xc);
        if (local_98 != (undefined1  [8])pp_Var1) {
          free((void *)local_98);
        }
        if (p_Var7 == (_Safe_iterator_base *)0xffffffffffffffff) goto LAB_00116201;
        std::__cxx11::stringbuf::str();
        p_Var7 = (_Safe_iterator_base *)
                 std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                      "(30, thirty)",0,0xc);
        if (local_98 != (undefined1  [8])pp_Var1) {
          free((void *)local_98);
        }
        if (p_Var7 == (_Safe_iterator_base *)0xffffffffffffffff) goto LAB_00116206;
        __gnu_cxx::
        hashtable<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int,___gnu_cxx::hash<int>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<int>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::hashtable((hashtable<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int,___gnu_cxx::hash<int>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<int>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_98,
                    (hashtable<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int,___gnu_cxx::hash<int>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<int>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)auStack_e8);
        bVar3 = __gnu_cxx::operator==
                          ((hashtable<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int,___gnu_cxx::hash<int>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<int>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)auStack_e8,
                           (hashtable<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int,___gnu_cxx::hash<int>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<int>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_98);
        if (!bVar3) {
          local_a0.str_ =
               google::
               MakeCheckOpString<__gnu_cxx::hash_map<int,std::__cxx11::string,__gnu_cxx::hash<int>,std::equal_to<int>,std::allocator<std::__cxx11::string>>,__gnu_cxx::hash_map<int,std::__cxx11::string,__gnu_cxx::hash<int>,std::equal_to<int>,std::allocator<std::__cxx11::string>>>
                         ((hash_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::hash<int>,_std::equal_to<int>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)auStack_e8,
                          (hash_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::hash<int>,_std::equal_to<int>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_98,"hm == copied_hm");
          if ((_Safe_iterator_base *)local_a0.str_ != (_Safe_iterator_base *)0x0) {
            google::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_50,
                       "/workspace/llm4binary/github/license_c_cmakelists/koeppl[P]separate_chaining/external/glog/src/stl_logging_unittest.cc"
                       ,0x85,&local_a0);
            google::LogMessage::stream((LogMessage *)&local_50);
            goto LAB_001162c7;
          }
        }
        __gnu_cxx::
        hashtable<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int,___gnu_cxx::hash<int>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<int>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~hashtable((hashtable<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int,___gnu_cxx::hash<int>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<int>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_98);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_268);
        std::ios_base::~ios_base(local_1f8);
        __gnu_cxx::
        hashtable<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int,___gnu_cxx::hash<int>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<int>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~hashtable((hashtable<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int,___gnu_cxx::hash<int>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<int>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)auStack_e8);
        copied_v.
        super__Safe_container<std::__debug::vector<int,_std::allocator<int>_>,_std::allocator<int>,___gnu_debug::_Safe_sequence,_true>
        .super__Safe_sequence<std::__debug::vector<int,_std::allocator<int>_>_>.
        super__Safe_sequence_base._M_iterators = (_Safe_iterator_base *)0x0;
        local_98 = (undefined1  [8])pp_Var1;
        copied_v.
        super__Safe_container<std::__debug::vector<int,_std::allocator<int>_>,_std::allocator<int>,___gnu_debug::_Safe_sequence,_true>
        .super__Safe_sequence<std::__debug::vector<int,_std::allocator<int>_>_>.
        super__Safe_sequence_base._M_const_iterators._0_1_ = 0;
        auStack_e8 = (undefined1  [8])0x0;
        v.
        super__Safe_container<std::__debug::vector<int,_std::allocator<int>_>,_std::allocator<int>,___gnu_debug::_Safe_sequence,_true>
        .super__Safe_sequence<std::__debug::vector<int,_std::allocator<int>_>_>.
        super__Safe_sequence_base._M_iterators = (_Safe_iterator_base *)0x0;
        v.
        super__Safe_container<std::__debug::vector<int,_std::allocator<int>_>,_std::allocator<int>,___gnu_debug::_Safe_sequence,_true>
        .super__Safe_sequence<std::__debug::vector<int,_std::allocator<int>_>_>.
        super__Safe_sequence_base._M_const_iterators._0_4_ = 1;
        local_50._M_dataplus._M_p._0_4_ = 0;
        v._16_32_ = ZEXT432(0) << 0x40;
        do {
          std::__debug::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)auStack_e8,(int *)&local_50);
          if (0 < (int)(uint)local_50._M_dataplus._M_p) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                      ' ');
          }
          snprintf((char *)local_268,0x100,"%d",(ulong)(uint)local_50._M_dataplus._M_p);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                     (char *)local_268);
          uVar5 = (uint)local_50._M_dataplus._M_p + 1;
          bVar3 = (int)(uint)local_50._M_dataplus._M_p < 99;
          local_50._M_dataplus._M_p._0_4_ = uVar5;
        } while (bVar3);
        local_268._0_4_ = 100;
        std::__debug::vector<int,_std::allocator<int>_>::emplace_back<int>
                  ((vector<int,_std::allocator<int>_> *)auStack_e8,(int *)local_268);
        pp_Var1 = &copied_v.
                   super__Safe_container<std::__debug::vector<int,_std::allocator<int>_>,_std::allocator<int>,___gnu_debug::_Safe_sequence,_true>
                   .super__Safe_sequence<std::__debug::vector<int,_std::allocator<int>_>_>.
                   super__Safe_sequence_base._M_const_iterators;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                   " ...");
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_268);
        operator<<((ostream *)local_268,(vector<int,_std::allocator<int>_> *)auStack_e8);
        std::__cxx11::stringbuf::str();
        local_a0.str_ = (string *)local_98;
        iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare(&local_50,(char *)local_98);
        if (iVar4 == 0) {
          p_Var7 = (_Safe_iterator_base *)0x0;
        }
        else {
          p_Var7 = (_Safe_iterator_base *)
                   google::MakeCheckOpString<std::__cxx11::string,char_const*>
                             (&local_50,(char **)&local_a0,"ss.str() == expected.c_str()");
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_50._M_dataplus._M_p._4_4_,(uint)local_50._M_dataplus._M_p) !=
            &local_50.field_2) {
          free((undefined1 *)
               CONCAT44(local_50._M_dataplus._M_p._4_4_,(uint)local_50._M_dataplus._M_p));
        }
        if (p_Var7 == (_Safe_iterator_base *)0x0) {
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_268);
          std::ios_base::~ios_base(local_1f8);
          if (local_98 != (undefined1  [8])pp_Var1) {
            free((void *)local_98);
          }
          std::__debug::vector<int,_std::allocator<int>_>::~vector
                    ((vector<int,_std::allocator<int>_> *)auStack_e8);
          v.
          super__Safe_vector<std::__debug::vector<int,_std::allocator<int>_>,_std::__cxx1998::vector<int,_std::allocator<int>_>_>
          ._M_guaranteed_capacity = (size_type)&v.super_vector<int,_std::allocator<int>_>;
          puVar2 = &v.
                    super__Safe_container<std::__debug::vector<int,_std::allocator<int>_>,_std::allocator<int>,___gnu_debug::_Safe_sequence,_true>
                    .super__Safe_sequence<std::__debug::vector<int,_std::allocator<int>_>_>.
                    super__Safe_sequence_base._M_version;
          auStack_e8 = (undefined1  [8])0x0;
          v.
          super__Safe_container<std::__debug::vector<int,_std::allocator<int>_>,_std::allocator<int>,___gnu_debug::_Safe_sequence,_true>
          .super__Safe_sequence<std::__debug::vector<int,_std::allocator<int>_>_>.
          super__Safe_sequence_base._M_iterators = (_Safe_iterator_base *)0x0;
          v.
          super__Safe_container<std::__debug::vector<int,_std::allocator<int>_>,_std::allocator<int>,___gnu_debug::_Safe_sequence,_true>
          .super__Safe_sequence<std::__debug::vector<int,_std::allocator<int>_>_>.
          super__Safe_sequence_base._M_const_iterators._0_4_ = 1;
          v.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
          _M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
          v.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          v.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)v.
                        super__Safe_vector<std::__debug::vector<int,_std::allocator<int>_>,_std::__cxx1998::vector<int,_std::allocator<int>_>_>
                        ._M_guaranteed_capacity;
          local_268._0_4_ = 0x14;
          pmVar9 = std::__cxx1998::
                   map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::greater<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::greater<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)puVar2,(key_type *)local_268);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_replace(pmVar9,0,pmVar9->_M_string_length,"twenty",6);
          local_268._0_4_ = 10;
          pmVar9 = std::__cxx1998::
                   map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::greater<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::greater<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)puVar2,(key_type *)local_268);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_replace(pmVar9,0,pmVar9->_M_string_length,"ten",3);
          local_268._0_4_ = 0x1e;
          pmVar9 = std::__cxx1998::
                   map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::greater<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::greater<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)puVar2,(key_type *)local_268);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_replace(pmVar9,0,pmVar9->_M_string_length,"thirty",6);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_268);
          operator<<((ostream *)local_268,
                     (map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::greater<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)auStack_e8);
          std::__cxx11::stringbuf::str();
          iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_98,"(30, thirty) (20, twenty) (10, ten)");
          if (local_98 != (undefined1  [8])pp_Var1) {
            free((void *)local_98);
          }
          if (iVar4 == 0) {
            std::__debug::
            map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::greater<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::map((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::greater<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_98,
                  (map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::greater<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)auStack_e8);
            if (local_58 == 0) {
              bVar3 = std::__equal<false>::
                      equal<std::_Rb_tree_const_iterator<std::pair<int_const,std::__cxx11::string>>,std::_Rb_tree_const_iterator<std::pair<int_const,std::__cxx11::string>>>
                                ((_Rb_tree_const_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )v.super_vector<int,_std::allocator<int>_>.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage,
                                 (_Rb_tree_const_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )&v.super_vector<int,_std::allocator<int>_>,
                                 (_Rb_tree_const_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )copied_v.super_vector<int,_std::allocator<int>_>.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage);
              if (!bVar3) goto LAB_0011610c;
            }
            else {
LAB_0011610c:
              p_Var7 = (_Safe_iterator_base *)
                       google::
                       MakeCheckOpString<std::__debug::map<int,std::__cxx11::string,std::greater<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>,std::__debug::map<int,std::__cxx11::string,std::greater<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>>
                                 ((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::greater<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)auStack_e8,
                                  (map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::greater<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)local_98,"m == copied_m");
              if (p_Var7 != (_Safe_iterator_base *)0x0) {
                local_a0.str_ = (string *)p_Var7;
                google::LogMessageFatal::LogMessageFatal
                          ((LogMessageFatal *)&local_50,
                           "/workspace/llm4binary/github/license_c_cmakelists/koeppl[P]separate_chaining/external/glog/src/stl_logging_unittest.cc"
                           ,0xa7,&local_a0);
                google::LogMessage::stream((LogMessage *)&local_50);
                goto LAB_001162c7;
              }
            }
            std::__debug::
            map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::greater<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::~map((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::greater<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_98);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_268);
            std::ios_base::~ios_base(local_1f8);
            std::__debug::
            map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::greater<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::~map((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::greater<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)auStack_e8);
            __gnu_cxx::hash_set<int,_user_hash,_std::equal_to<int>,_std::allocator<int>_>::hash_set
                      ((hash_set<int,_user_hash,_std::equal_to<int>,_std::allocator<int>_> *)
                       auStack_e8);
            local_98._0_4_ = 10;
            __gnu_cxx::
            hashtable<int,_int,_user_hash,_std::_Identity<int>,_std::equal_to<int>,_std::allocator<int>_>
            ::resize((hashtable<int,_int,_user_hash,_std::_Identity<int>,_std::equal_to<int>,_std::allocator<int>_>
                      *)auStack_e8,1);
            __gnu_cxx::
            hashtable<int,_int,_user_hash,_std::_Identity<int>,_std::equal_to<int>,_std::allocator<int>_>
            ::insert_unique_noresize
                      ((pair<__gnu_cxx::_Hashtable_iterator<int,_int,_user_hash,_std::_Identity<int>,_std::equal_to<int>,_std::allocator<int>_>,_bool>
                        *)local_268,
                       (hashtable<int,_int,_user_hash,_std::_Identity<int>,_std::equal_to<int>,_std::allocator<int>_>
                        *)auStack_e8,(value_type_conflict *)local_98);
            local_98._0_4_ = 0x14;
            __gnu_cxx::
            hashtable<int,_int,_user_hash,_std::_Identity<int>,_std::equal_to<int>,_std::allocator<int>_>
            ::resize((hashtable<int,_int,_user_hash,_std::_Identity<int>,_std::equal_to<int>,_std::allocator<int>_>
                      *)auStack_e8,1);
            __gnu_cxx::
            hashtable<int,_int,_user_hash,_std::_Identity<int>,_std::equal_to<int>,_std::allocator<int>_>
            ::insert_unique_noresize
                      ((pair<__gnu_cxx::_Hashtable_iterator<int,_int,_user_hash,_std::_Identity<int>,_std::equal_to<int>,_std::allocator<int>_>,_bool>
                        *)local_268,
                       (hashtable<int,_int,_user_hash,_std::_Identity<int>,_std::equal_to<int>,_std::allocator<int>_>
                        *)auStack_e8,(value_type_conflict *)local_98);
            local_98._0_4_ = 0x1e;
            __gnu_cxx::
            hashtable<int,_int,_user_hash,_std::_Identity<int>,_std::equal_to<int>,_std::allocator<int>_>
            ::resize((hashtable<int,_int,_user_hash,_std::_Identity<int>,_std::equal_to<int>,_std::allocator<int>_>
                      *)auStack_e8,1);
            __gnu_cxx::
            hashtable<int,_int,_user_hash,_std::_Identity<int>,_std::equal_to<int>,_std::allocator<int>_>
            ::insert_unique_noresize
                      ((pair<__gnu_cxx::_Hashtable_iterator<int,_int,_user_hash,_std::_Identity<int>,_std::equal_to<int>,_std::allocator<int>_>,_bool>
                        *)local_268,
                       (hashtable<int,_int,_user_hash,_std::_Identity<int>,_std::equal_to<int>,_std::allocator<int>_>
                        *)auStack_e8,(value_type_conflict *)local_98);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_268);
            _local_98 = __gnu_cxx::
                        hashtable<int,_int,_user_hash,_std::_Identity<int>,_std::equal_to<int>,_std::allocator<int>_>
                        ::begin((hashtable<int,_int,_user_hash,_std::_Identity<int>,_std::equal_to<int>,_std::allocator<int>_>
                                 *)auStack_e8);
            if (local_98 != (undefined1  [8])0x0) {
              uVar5 = 0;
              do {
                auVar10 = local_98;
                if (uVar5 != 0) {
                  local_50._M_dataplus._M_p._0_4_ = CONCAT31(local_50._M_dataplus._M_p._1_3_,0x20);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_268,(char *)&local_50,1);
                  auVar10 = local_98;
                }
                std::ostream::operator<<((ostream *)local_268,((_Node *)auVar10)->_M_val);
                __gnu_cxx::
                _Hashtable_const_iterator<int,_int,_user_hash,_std::_Identity<int>,_std::equal_to<int>,_std::allocator<int>_>
                ::operator++((_Hashtable_const_iterator<int,_int,_user_hash,_std::_Identity<int>,_std::equal_to<int>,_std::allocator<int>_>
                              *)local_98);
              } while ((uVar5 < 99) && (uVar5 = uVar5 + 1, local_98 != (undefined1  [8])0x0));
              if (local_98 != (undefined1  [8])0x0) {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_268," ...",4);
              }
            }
            std::__cxx11::stringbuf::str();
            p_Var7 = copied_v.
                     super__Safe_container<std::__debug::vector<int,_std::allocator<int>_>,_std::allocator<int>,___gnu_debug::_Safe_sequence,_true>
                     .super__Safe_sequence<std::__debug::vector<int,_std::allocator<int>_>_>.
                     super__Safe_sequence_base._M_iterators;
            if (local_98 != (undefined1  [8])pp_Var1) {
              free((void *)local_98);
            }
            if (p_Var7 != (_Safe_iterator_base *)0x8) goto LAB_0011623d;
            std::__cxx11::stringbuf::str();
            sVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_98,"10",0,2);
            if (local_98 != (undefined1  [8])pp_Var1) {
              free((void *)local_98);
            }
            if (sVar11 == 0xffffffffffffffff) goto LAB_00116242;
            std::__cxx11::stringbuf::str();
            sVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_98,"20",0,2);
            if (local_98 != (undefined1  [8])pp_Var1) {
              free((void *)local_98);
            }
            if (sVar11 == 0xffffffffffffffff) goto LAB_00116247;
            std::__cxx11::stringbuf::str();
            sVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_98,"30",0,2);
            if (local_98 != (undefined1  [8])pp_Var1) {
              free((void *)local_98);
            }
            if (sVar11 != 0xffffffffffffffff) {
              __gnu_cxx::
              hashtable<int,_int,_user_hash,_std::_Identity<int>,_std::equal_to<int>,_std::allocator<int>_>
              ::hashtable((hashtable<int,_int,_user_hash,_std::_Identity<int>,_std::equal_to<int>,_std::allocator<int>_>
                           *)local_98,
                          (hashtable<int,_int,_user_hash,_std::_Identity<int>,_std::equal_to<int>,_std::allocator<int>_>
                           *)auStack_e8);
              bVar3 = __gnu_cxx::operator==
                                ((hashtable<int,_int,_user_hash,_std::_Identity<int>,_std::equal_to<int>,_std::allocator<int>_>
                                  *)auStack_e8,
                                 (hashtable<int,_int,_user_hash,_std::_Identity<int>,_std::equal_to<int>,_std::allocator<int>_>
                                  *)local_98);
              if (bVar3) {
LAB_00115f9a:
                __gnu_cxx::
                hashtable<int,_int,_user_hash,_std::_Identity<int>,_std::equal_to<int>,_std::allocator<int>_>
                ::~hashtable((hashtable<int,_int,_user_hash,_std::_Identity<int>,_std::equal_to<int>,_std::allocator<int>_>
                              *)local_98);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_268);
                std::ios_base::~ios_base(local_1f8);
                __gnu_cxx::
                hashtable<int,_int,_user_hash,_std::_Identity<int>,_std::equal_to<int>,_std::allocator<int>_>
                ::~hashtable((hashtable<int,_int,_user_hash,_std::_Identity<int>,_std::equal_to<int>,_std::allocator<int>_>
                              *)auStack_e8);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"PASS\n",5)
                ;
                return 0;
              }
              p_Var7 = (_Safe_iterator_base *)
                       google::
                       MakeCheckOpString<__gnu_cxx::hash_set<int,user_hash,std::equal_to<int>,std::allocator<int>>,__gnu_cxx::hash_set<int,user_hash,std::equal_to<int>,std::allocator<int>>>
                                 ((hash_set<int,_user_hash,_std::equal_to<int>,_std::allocator<int>_>
                                   *)auStack_e8,
                                  (hash_set<int,_user_hash,_std::equal_to<int>,_std::allocator<int>_>
                                   *)local_98,"hs == copied_hs");
              if (p_Var7 == (_Safe_iterator_base *)0x0) goto LAB_00115f9a;
              local_a0.str_ = (string *)p_Var7;
              google::LogMessageFatal::LogMessageFatal
                        ((LogMessageFatal *)&local_50,
                         "/workspace/llm4binary/github/license_c_cmakelists/koeppl[P]separate_chaining/external/glog/src/stl_logging_unittest.cc"
                         ,0xb9,&local_a0);
              google::LogMessage::stream((LogMessage *)&local_50);
              goto LAB_001162c7;
            }
          }
          else {
            main_cold_5();
LAB_0011623d:
            main_cold_6();
LAB_00116242:
            main_cold_9();
LAB_00116247:
            main_cold_8();
          }
          main_cold_7();
          goto LAB_001162c7;
        }
      }
      else {
        main_cold_2();
LAB_001161e3:
        main_cold_3();
LAB_001161e8:
        main_cold_15();
LAB_001161ed:
        main_cold_14();
LAB_001161f2:
        main_cold_13();
LAB_001161f7:
        main_cold_4();
LAB_001161fc:
        main_cold_12();
LAB_00116201:
        main_cold_11();
LAB_00116206:
        main_cold_10();
      }
      local_a0.str_ = (string *)p_Var7;
      google::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_50,
                 "/workspace/llm4binary/github/license_c_cmakelists/koeppl[P]separate_chaining/external/glog/src/stl_logging_unittest.cc"
                 ,0x99,&local_a0);
      google::LogMessage::stream((LogMessage *)&local_50);
      goto LAB_001162c7;
    }
  }
  else {
    main_cold_1();
    local_a0.str_ = (string *)extraout_RAX;
  }
  google::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_50,
             "/workspace/llm4binary/github/license_c_cmakelists/koeppl[P]separate_chaining/external/glog/src/stl_logging_unittest.cc"
             ,0x55,&local_a0);
  google::LogMessage::stream((LogMessage *)&local_50);
LAB_001162c7:
  google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_50);
}

Assistant:

int main(int, char**) {
  TestSTLLogging();
  std::cout << "PASS\n";
  return 0;
}